

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

Header * SQLite::Database::getHeaderInfo(Header *__return_storage_ptr__,string *aFilename)

{
  long lVar1;
  char cVar2;
  int iVar3;
  Exception *pEVar4;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  ifstream fileBuffer;
  size_type local_298;
  uchar buf [100];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (aFilename->_M_string_length == 0) {
    pEVar4 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(pEVar4,"Filename parameter is empty");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pEVar4,&Exception::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    std::ifstream::ifstream(&fileBuffer,(aFilename->_M_dataplus)._M_p,_S_in|_S_bin);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      pEVar4 = (Exception *)__cxa_allocate_exception(0x18);
      std::operator+(&local_2c0,"Error opening file ",aFilename);
      Exception::Exception(pEVar4,&local_2c0);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pEVar4,&Exception::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      std::istream::seekg((long)&fileBuffer,_S_beg);
      std::istream::read((char *)&fileBuffer,(long)buf);
      std::ifstream::close();
      if ((long)local_298 < 100) {
        pEVar4 = (Exception *)__cxa_allocate_exception(0x18);
        std::operator+(&local_2e0,"File ",aFilename);
        std::operator+(&local_2c0,&local_2e0," is too short");
        Exception::Exception(pEVar4,&local_2c0);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pEVar4,&Exception::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else {
        std::ifstream::~ifstream(&fileBuffer);
        *(undefined8 *)__return_storage_ptr__->headerStr = buf._0_8_;
        *(undefined8 *)(__return_storage_ptr__->headerStr + 8) = buf._8_8_;
        __return_storage_ptr__->headerStr[0xf] = '\0';
        iVar3 = bcmp(__return_storage_ptr__,"SQLite format 3",0xf);
        if (iVar3 == 0) {
          __return_storage_ptr__->pageSizeBytes =
               (uint)(ushort)(buf._16_2_ << 8 | (ushort)buf._16_2_ >> 8);
          __return_storage_ptr__->fileFormatWriteVersion = buf[0x12];
          __return_storage_ptr__->fileFormatReadVersion = buf[0x13];
          __return_storage_ptr__->reservedSpaceBytes = buf[0x14];
          __return_storage_ptr__->maxEmbeddedPayloadFrac = buf[0x15];
          __return_storage_ptr__->minEmbeddedPayloadFrac = buf[0x16];
          __return_storage_ptr__->leafPayloadFrac = buf[0x17];
          __return_storage_ptr__->fileChangeCounter =
               (ulong)buf[0x1b] |
               (ulong)buf[0x1a] << 8 | (long)(int)(buf._24_4_ << 0x18) | (ulong)buf[0x19] << 0x10;
          __return_storage_ptr__->databaseSizePages =
               (ulong)buf[0x1f] |
               (ulong)buf[0x1e] << 8 | (long)(int)(buf._28_4_ << 0x18) | (ulong)buf[0x1d] << 0x10;
          __return_storage_ptr__->firstFreelistTrunkPage =
               (ulong)buf[0x23] |
               (ulong)buf[0x22] << 8 | (long)(int)(buf._32_4_ << 0x18) | (ulong)buf[0x21] << 0x10;
          __return_storage_ptr__->totalFreelistPages =
               (ulong)buf[0x27] |
               (ulong)buf[0x26] << 8 | (long)(int)(buf._36_4_ << 0x18) | (ulong)buf[0x25] << 0x10;
          __return_storage_ptr__->schemaCookie =
               (ulong)buf[0x2b] |
               (ulong)buf[0x2a] << 8 | (long)(int)(buf._40_4_ << 0x18) | (ulong)buf[0x29] << 0x10;
          __return_storage_ptr__->schemaFormatNumber =
               (ulong)buf[0x2f] |
               (ulong)buf[0x2e] << 8 | (long)(int)(buf._44_4_ << 0x18) | (ulong)buf[0x2d] << 0x10;
          __return_storage_ptr__->defaultPageCacheSizeBytes =
               (ulong)buf[0x33] |
               (ulong)buf[0x32] << 8 | (long)(int)(buf._48_4_ << 0x18) | (ulong)buf[0x31] << 0x10;
          __return_storage_ptr__->largestBTreePageNumber =
               (ulong)buf[0x37] |
               (ulong)buf[0x36] << 8 | (long)(int)(buf._52_4_ << 0x18) | (ulong)buf[0x35] << 0x10;
          __return_storage_ptr__->databaseTextEncoding =
               (ulong)buf[0x3b] |
               (ulong)buf[0x3a] << 8 | (long)(int)(buf._56_4_ << 0x18) | (ulong)buf[0x39] << 0x10;
          __return_storage_ptr__->userVersion =
               (ulong)buf[0x3f] |
               (ulong)buf[0x3e] << 8 | (long)(int)(buf._60_4_ << 0x18) | (ulong)buf[0x3d] << 0x10;
          __return_storage_ptr__->incrementalVaccumMode =
               (ulong)buf[0x43] |
               (ulong)buf[0x42] << 8 | (long)(int)(buf._64_4_ << 0x18) | (ulong)buf[0x41] << 0x10;
          __return_storage_ptr__->applicationId =
               (ulong)buf[0x47] |
               (ulong)buf[0x46] << 8 | (long)(int)(buf._68_4_ << 0x18) | (ulong)buf[0x45] << 0x10;
          __return_storage_ptr__->versionValidFor =
               (ulong)buf[0x5f] |
               (ulong)buf[0x5e] << 8 | (long)(int)(buf._92_4_ << 0x18) | (ulong)buf[0x5d] << 0x10;
          __return_storage_ptr__->sqliteVersion =
               (ulong)buf[99] |
               (ulong)buf[0x62] << 8 | (long)(int)(buf._96_4_ << 0x18) | (ulong)buf[0x61] << 0x10;
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            return __return_storage_ptr__;
          }
        }
        else {
          pEVar4 = (Exception *)__cxa_allocate_exception(0x18);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &fileBuffer,"Invalid or encrypted SQLite header in file ",aFilename);
          Exception::Exception(pEVar4,(string *)&fileBuffer);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(pEVar4,&Exception::typeinfo,std::runtime_error::~runtime_error);
          }
        }
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

Header Database::getHeaderInfo(const std::string& aFilename)
{
    Header h;
    unsigned char buf[100];
    char* pBuf = reinterpret_cast<char*>(&buf[0]);
    char* pHeaderStr = reinterpret_cast<char*>(&h.headerStr[0]);

    if (aFilename.empty())
    {
        throw SQLite::Exception("Filename parameter is empty");
    }

    {
        std::ifstream fileBuffer(aFilename.c_str(), std::ios::in | std::ios::binary);
        if (fileBuffer.is_open())
        {
            fileBuffer.seekg(0, std::ios::beg);
            fileBuffer.read(pBuf, 100);
            fileBuffer.close();
            if (fileBuffer.gcount() < 100)
            {
                throw SQLite::Exception("File " + aFilename + " is too short");
            }
        }
        else
        {
            throw SQLite::Exception("Error opening file " + aFilename);
        }
    }

    // If the "magic string" can't be found then header is invalid, corrupt or unreadable
    memcpy(pHeaderStr, pBuf, 16);
    pHeaderStr[15] = '\0';
    if (strncmp(pHeaderStr, "SQLite format 3", 15) != 0)
    {
        throw SQLite::Exception("Invalid or encrypted SQLite header in file " + aFilename);
    }

    h.pageSizeBytes = (buf[16] << 8) | buf[17];
    h.fileFormatWriteVersion = buf[18];
    h.fileFormatReadVersion = buf[19];
    h.reservedSpaceBytes = buf[20];
    h.maxEmbeddedPayloadFrac = buf[21];
    h.minEmbeddedPayloadFrac = buf[22];
    h.leafPayloadFrac = buf[23];

    h.fileChangeCounter =
        (buf[24] << 24) |
        (buf[25] << 16) |
        (buf[26] << 8)  |
        (buf[27] << 0);

    h.databaseSizePages =
        (buf[28] << 24) |
        (buf[29] << 16) |
        (buf[30] << 8)  |
        (buf[31] << 0);

    h.firstFreelistTrunkPage =
        (buf[32] << 24) |
        (buf[33] << 16) |
        (buf[34] << 8)  |
        (buf[35] << 0);

    h.totalFreelistPages =
        (buf[36] << 24) |
        (buf[37] << 16) |
        (buf[38] << 8)  |
        (buf[39] << 0);

    h.schemaCookie =
        (buf[40] << 24) |
        (buf[41] << 16) |
        (buf[42] << 8)  |
        (buf[43] << 0);

    h.schemaFormatNumber =
        (buf[44] << 24) |
        (buf[45] << 16) |
        (buf[46] << 8)  |
        (buf[47] << 0);

    h.defaultPageCacheSizeBytes =
        (buf[48] << 24) |
        (buf[49] << 16) |
        (buf[50] << 8)  |
        (buf[51] << 0);

    h.largestBTreePageNumber =
        (buf[52] << 24) |
        (buf[53] << 16) |
        (buf[54] << 8)  |
        (buf[55] << 0);

    h.databaseTextEncoding =
        (buf[56] << 24) |
        (buf[57] << 16) |
        (buf[58] << 8)  |
        (buf[59] << 0);

    h.userVersion =
        (buf[60] << 24) |
        (buf[61] << 16) |
        (buf[62] << 8)  |
        (buf[63] << 0);

    h.incrementalVaccumMode =
        (buf[64] << 24) |
        (buf[65] << 16) |
        (buf[66] << 8)  |
        (buf[67] << 0);

    h.applicationId =
        (buf[68] << 24) |
        (buf[69] << 16) |
        (buf[70] << 8)  |
        (buf[71] << 0);

    h.versionValidFor =
        (buf[92] << 24) |
        (buf[93] << 16) |
        (buf[94] << 8)  |
        (buf[95] << 0);

    h.sqliteVersion =
        (buf[96] << 24) |
        (buf[97] << 16) |
        (buf[98] << 8)  |
        (buf[99] << 0);

    return h;
}